

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light.hpp
# Opt level: O0

void contract_light::v_100::contract_detail::InvariantPolicy::
     checkInvariant<contract_light::v_100::contract_detail::ContractContext<(anonymous_namespace)::TestClassWithInvariant>const>
               (ContractContext<(anonymous_namespace)::TestClassWithInvariant> *ctx)

{
  bool bVar1;
  Contract *pCVar2;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  
  pCVar2 = anon_unknown.dwarf_114b::TestClassWithInvariant::contract_light_contractor
                     ((TestClassWithInvariant *)*in_RDI);
  Contract::popInvariantFromStack(pCVar2);
  pCVar2 = anon_unknown.dwarf_114b::TestClassWithInvariant::contract_light_contractor
                     ((TestClassWithInvariant *)*in_RDI);
  bVar1 = Contract::stackEmpty(pCVar2);
  if ((bVar1) &&
     (bVar1 = anon_unknown.dwarf_114b::TestClassWithInvariant::invariant
                        ((TestClassWithInvariant *)*in_RDI), !bVar1)) {
    handleFailedInvariant
              ((char *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void checkInvariant(Context& ctx) NOEXCEPT{
          ctx.provider.contract_light_contractor().popInvariantFromStack();
          if (ctx.provider.contract_light_contractor().stackEmpty() &&
            !ctx.provider.invariant()) {
            handleFailedInvariant(ctx.fileName, ctx.line);
          }
        }